

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O0

int bsp_find_closest(void *handle,float *point)

{
  int iVar1;
  float *point_00;
  long in_RSI;
  long *in_RDI;
  float fVar2;
  double dVar3;
  float diff_1;
  float diff;
  int *indexarray;
  float bestradius;
  float radius;
  bsp_tree *tree;
  int cnt;
  int d;
  int i;
  int closest;
  int close;
  int **in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  float fVar4;
  float fVar5;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar6;
  int iVar7;
  undefined4 in_stack_ffffffffffffffdc;
  float local_20;
  float local_4;
  
  iVar1 = _bsp_find_close((bsp_node *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          (float *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          (int)((ulong)in_RDI >> 0x20));
  if (iVar1 == -1) {
    local_4 = -NAN;
  }
  else {
    fVar4 = 0.0;
    for (iVar6 = 0; iVar6 < (int)(uint)*(byte *)(in_RDI + 1); iVar6 = iVar6 + 1) {
      in_stack_ffffffffffffffb4 =
           *(float *)(in_RSI + (long)iVar6 * 4) -
           *(float *)(*(long *)(*in_RDI + (long)iVar6 * 8) + (long)iVar1 * 4);
      fVar4 = in_stack_ffffffffffffffb4 * in_stack_ffffffffffffffb4 + fVar4;
    }
    dVar3 = sqrt((double)fVar4);
    fVar4 = (float)dVar3;
    point_00 = (float *)array_create_int(0);
    bsp_find_points((void *)CONCAT44(fVar4,in_stack_ffffffffffffffc0),point_00,
                    in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    iVar1 = array_count(point_00);
    local_20 = -NAN;
    fVar4 = 3.4028235e+38;
    for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
      fVar5 = 0.0;
      for (iVar7 = 0; iVar7 < (int)(uint)*(byte *)(in_RDI + 1); iVar7 = iVar7 + 1) {
        fVar2 = *(float *)(in_RSI + (long)iVar7 * 4) -
                *(float *)(*(long *)(*in_RDI + (long)iVar7 * 8) + (long)(int)point_00[iVar6] * 4);
        fVar5 = fVar2 * fVar2 + fVar5;
      }
      if (fVar5 < fVar4) {
        local_20 = point_00[iVar6];
        fVar4 = fVar5;
      }
    }
    array_destroy((void *)0x1043b9);
    local_4 = local_20;
  }
  return (int)local_4;
}

Assistant:

int
bsp_find_closest(
    void * handle,
    float * point )
{
    int close, closest, i, d, cnt;
    bsp_tree * tree;
    float radius, bestradius;
    int * indexarray;

    tree = (bsp_tree *) handle;
    assert( tree != NULL );

    close = _bsp_find_close( tree->top, point, tree->dimensions );
    if ( close == -1 ) return -1;

    radius = 0.0f;
    for ( d = 0; d < tree->dimensions; d++ ) {
        float diff;
        diff = point[d] - tree->pointarrays[d][close];
        radius += diff * diff;
    }
    radius = (float) sqrt( radius );

    indexarray = array_create_int( 8 );
    bsp_find_points( tree, point, radius, &indexarray );

    cnt = array_count( indexarray );
    closest = -1;
    bestradius = FLT_MAX;
    for ( i = 0; i < cnt; i++ ) {
        radius = 0.0f;
        for ( d = 0; d < tree->dimensions; d++ ) {
            float diff;
            diff = point[d] - tree->pointarrays[d][indexarray[i]];
            radius += diff * diff;
        }
        if ( radius < bestradius ) {
            closest = indexarray[i];
            bestradius = radius;
        }
    }

    array_destroy( indexarray );
    return closest;
}